

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  float32 ***B_00;
  float32 ****A_00;
  int iVar1;
  int32 iVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  double dVar14;
  float fVar15;
  uint32 n_mllr_class;
  uint32 n_stream;
  uint32 n_mgau;
  uint32 n_mgau_rd;
  uint32 *veclen;
  uint32 n_density;
  char *local_c8;
  int32 *cb2mllr;
  uint32 *veclen_rd;
  vector_t ***wt_var;
  float local_a4;
  uint32 n_density_rd;
  uint32 n_stream_rd;
  float32 ***wt_dcount;
  vector_t ***wt_mean;
  vector_t ***mean;
  long local_80;
  long local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  long local_58;
  model_def_t *mdef;
  float32 ***B;
  float32 ****A;
  int32 pass2var;
  
  mean = (vector_t ***)0x0;
  wt_mean = (vector_t ***)0x0;
  wt_dcount = (float32 ***)0x0;
  wt_var = (vector_t ***)0x0;
  veclen = (uint32 *)0x0;
  veclen_rd = (uint32 *)0x0;
  A = (float32 ****)0x0;
  B = (float32 ***)0x0;
  cb2mllr = (int32 *)0x0;
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-outmllrfn");
  pcVar3 = cmd_ln_get();
  ppcVar5 = cmd_ln_str_list_r(pcVar3,"-accumdir");
  pcVar3 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar3,"-meanfn");
  pcVar3 = cmd_ln_get();
  local_60 = cmd_ln_str_r(pcVar3,"-varfn");
  pcVar3 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar3,"-cb2mllrfn");
  pcVar3 = cmd_ln_get();
  local_58 = cmd_ln_int_r(pcVar3,"-cdonly");
  pcVar3 = cmd_ln_get();
  local_c8 = cmd_ln_str_r(pcVar3,"-moddeffn");
  pcVar3 = cmd_ln_get();
  lVar8 = cmd_ln_int_r(pcVar3,"-mllrmult");
  pcVar3 = cmd_ln_get();
  lVar9 = cmd_ln_int_r(pcVar3,"-mllradd");
  pcVar3 = cmd_ln_get();
  dVar14 = cmd_ln_float_r(pcVar3,"-varfloor");
  if (*ppcVar5 == (char *)0x0) {
    __assert_fail("accum_dir[0] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                  ,0x16b,"int main(int, char **)");
  }
  if ((pcVar4 == (char *)0x0) || (pcVar6 == (char *)0x0)) {
    pcVar6 = "Some of options are missing.\n";
    lVar8 = 0x16e;
LAB_001034a2:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,lVar8,pcVar6);
    goto LAB_0010335d;
  }
  fVar15 = (float)dVar14;
  if (fVar15 < 0.0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x171,"varfloor is negative (%e)\n",(double)fVar15);
    goto LAB_0010335d;
  }
  if (pcVar7 == (char *)0x0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = pcVar7;
    if (((*pcVar7 == 'N') && (pcVar7[1] == 'O')) && (pcVar7[2] == '\0')) {
      local_68 = (char *)0x0;
    }
  }
  if (local_c8 == (char *)0x0) {
    local_c8 = (char *)0x0;
  }
  else if (((*local_c8 == 'N') && (local_c8[1] == 'O')) && (local_c8[2] == '\0')) {
    local_c8 = (char *)0x0;
  }
  local_a4 = fVar15;
  local_80 = lVar9;
  local_78 = lVar8;
  local_70 = pcVar4;
  fputc(10,_stderr);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x17e,"-- 1. Read input mean, (var) and accumulation.\n");
  iVar1 = s3gau_read(pcVar6,&mean,&n_mgau,&n_stream,&n_density,&veclen);
  if (iVar1 == 0) {
    uVar12 = 0;
    do {
      uVar13 = uVar12;
      if (ppcVar5[uVar13] == (char *)0x0) {
        uVar11 = (ulong)n_mgau;
        if (n_mgau != n_mgau_rd) {
          pcVar6 = "n_mgau mismatch (%u : %u)\n";
          lVar8 = 0x19c;
          goto LAB_00103480;
        }
        uVar11 = (ulong)n_stream;
        if (n_stream != n_stream_rd) {
          pcVar6 = "n_stream mismatch (%u : %u)\n";
          lVar8 = 0x19f;
          goto LAB_00103480;
        }
        if (n_density != n_density_rd) {
          pcVar6 = "n_density mismatch (%u : %u)\n";
          lVar8 = 0x1a2;
          uVar11 = (ulong)n_density;
          goto LAB_00103480;
        }
        uVar10 = 0;
        goto LAB_0010307d;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,0x18d,"Reading and accumulating counts from %s\n");
      iVar1 = rdacc_den(ppcVar5[uVar13],&wt_mean,&wt_var,&pass2var,&wt_dcount,&n_mgau_rd,
                        &n_stream_rd,&n_density_rd,&veclen_rd);
      uVar12 = uVar13 + 1;
    } while (iVar1 == 0);
    pcVar6 = ppcVar5[uVar13];
    pcVar4 = "Error in reading %s\n";
    lVar8 = 0x197;
  }
  else {
    pcVar4 = "Couldn\'t read %s";
    lVar8 = 0x188;
  }
LAB_0010302d:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,lVar8,pcVar4,pcVar6);
LAB_0010335d:
  exit(1);
LAB_0010307d:
  if (uVar11 == uVar10) goto LAB_00103098;
  if (veclen[uVar10] != veclen_rd[uVar10]) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x1a8,"vector length of stream %u (== %u) != prior length (== %u)\n",
            uVar10 & 0xffffffff,(ulong)veclen_rd[uVar10],(ulong)veclen[uVar10]);
    goto LAB_0010335d;
  }
  uVar10 = uVar10 + 1;
  goto LAB_0010307d;
LAB_00103098:
  ckd_free(veclen_rd);
  veclen_rd = (uint32 *)0x0;
  if (wt_var != (vector_t ***)0x0) {
    gauden_free_param(wt_var);
    wt_var = (vector_t ***)0x0;
  }
  fputc(10,_stderr);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x1b4,"-- 2. Read cb2mllrfn\n");
  pcVar6 = local_68;
  iVar1 = strcmp(local_68,".1cls.");
  if (iVar1 == 0) {
    n_mllr_class = 1;
    cb2mllr = (int32 *)__ckd_calloc__((ulong)n_mgau,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                      ,0x1b9);
    uVar12 = 1;
  }
  else {
    iVar1 = s3cb2mllr_read(pcVar6,&cb2mllr,&n_mgau_rd,&n_mllr_class);
    if (iVar1 != 0) {
      pcVar4 = "Unable to read %s\n";
      lVar8 = 0x1c0;
      goto LAB_0010302d;
    }
    uVar11 = (ulong)n_mgau_rd;
    uVar12 = n_mllr_class;
    if (n_mgau_rd != n_mgau) {
      pcVar6 = "cb2mllr maps %u cb, but read %u cb from files\n";
      lVar8 = 0x1c4;
LAB_00103480:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,lVar8,pcVar6,uVar11);
      goto LAB_0010335d;
    }
  }
  uVar13 = 0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x1c7,"n_mllr_class = %d\n",(ulong)uVar12);
  pcVar6 = local_c8;
  if ((int)local_58 != 0) {
    if (local_c8 == (char *)0x0) {
      pcVar6 = "-moddeffn is not given.\n";
      lVar8 = 0x1cd;
      goto LAB_001034a2;
    }
    iVar2 = model_def_read(&mdef,local_c8);
    if (iVar2 != 0) {
      pcVar4 = "Can not read model definition file %s\n";
      lVar8 = 0x1d0;
      goto LAB_0010302d;
    }
    uVar13 = mdef->n_tied_ci_state;
    for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      cb2mllr[uVar11] = -1;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x1d6,"Use CD senones only. (index >= %d)\n",(ulong)mdef->n_tied_ci_state);
  }
  fputc(10,_stderr);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x1db,"-- 3. Calculate mllr matrices\n");
  mllr_mat(&A,&B,local_60,mean,wt_mean,wt_dcount,uVar13,cb2mllr,(uint32)local_78,(uint32)local_80,
           (float32)local_a4,n_mgau,n_stream,n_density,n_mllr_class,veclen);
  fputc(10,_stderr);
  pcVar6 = local_70;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x1f1,"-- 4. Store mllr matrices (A,B) to %s\n",local_70);
  fflush(_stderr);
  A_00 = A;
  B_00 = B;
  iVar2 = store_reg_mat(pcVar6,veclen,n_mllr_class,n_stream,A,B);
  if (iVar2 == 0) {
    ckd_free(veclen);
    free_mllr_A(A_00,n_mllr_class,n_stream);
    free_mllr_B(B_00,n_mllr_class,n_stream);
    return 0;
  }
  pcVar4 = "Unable to write %s\n";
  lVar8 = 0x1fb;
  goto LAB_0010302d;
}

Assistant:

int main(int argc, char *argv[])
{
    const char  *out_mllr_fn;
    const char  **accum_dir;
    const char  *mean_fn;
    const char  *var_fn;
    const char  *cb2mllrfn;
    const char  *moddeffn;

    uint32      cdonly;
    uint32      mllr_mult;		/* option 0 or 1 */
    uint32      mllr_add;		/* option 0 or 1 */

    float32     varfloor;
    vector_t    ***mean         = NULL;         /* baseline mean */
    vector_t    ***wt_mean      = NULL;		/* read from bw accum */
    float32     ***wt_dcount    = NULL;		/* read from bw accum */
    vector_t    ***wt_var       = NULL;         /* not used */
    int32       pass2var;                       /* not used */

    uint32      n_mgau;
    uint32      n_stream;
    uint32      n_density;
    uint32      n_mllr_class;
    uint32      n_mgau_rd;
    uint32      n_stream_rd;
    uint32      n_density_rd;
    uint32 *veclen	= NULL;
    uint32 *veclen_rd	= NULL;

    float32     ****A  		= NULL;          /* Output mllr: A */
    float32     ***B   		= NULL;          /* Output mllr: B */

    int32       *cb2mllr   	= NULL;


    /*    int32       **mllr2cb  	= NULL;
	  int32       *n_mllr2cb 	= NULL;*/

    model_def_t *mdef;
    uint32	gau_begin;
    uint32 i,s ;

    if (initialize(argc, argv) != S3_SUCCESS) {
	E_FATAL("errors initializing.\n");
    }

    out_mllr_fn         = cmd_ln_str("-outmllrfn");
    accum_dir           = cmd_ln_str_list("-accumdir");
    mean_fn             = cmd_ln_str("-meanfn");
    var_fn              = cmd_ln_str("-varfn");

    cb2mllrfn           = cmd_ln_str("-cb2mllrfn");
    cdonly              = cmd_ln_int32("-cdonly");
    moddeffn            = cmd_ln_str("-moddeffn");

    mllr_mult      = cmd_ln_int32("-mllrmult");
    mllr_add            = cmd_ln_int32("-mllradd");
    varfloor            = cmd_ln_float32("-varfloor");


    assert(accum_dir[0] != NULL);	/* must be at least one accum dir */

    if (! (out_mllr_fn && accum_dir && mean_fn)) {
        E_FATAL("Some of options are missing.\n");
    }
    if (varfloor < 0.) {
        E_FATAL("varfloor is negative (%e)\n",varfloor);
    }


    if (cb2mllrfn && strcmp(cb2mllrfn,"NO") == 0) {
        cb2mllrfn = NULL;
    }
    if (moddeffn && strcmp(moddeffn,"NO") == 0) {
        moddeffn = NULL;
    }

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 1. Read input mean, (var) and accumulation.\n");
    /*--------------------------------------------------------------------*/

    /*-------------- Read baseline mean --------------*/
    if (s3gau_read(mean_fn,
                   &mean,
                   &n_mgau,
                   &n_stream,
                   &n_density,
                   &veclen) != S3_SUCCESS) {
        E_FATAL("Couldn't read %s", mean_fn);
    }

    /*-------- Read accum_dir (accumulation from bw) --------*/
    for (i = 0; accum_dir[i]; i++) {
        E_INFO("Reading and accumulating counts from %s\n", accum_dir[i]);
        if (rdacc_den(accum_dir[i],
                      &wt_mean,
                      &wt_var,          
                      &pass2var,        
                      &wt_dcount,
                      &n_mgau_rd,
                      &n_stream_rd,
                      &n_density_rd,
                      &veclen_rd) != S3_SUCCESS) {
            E_FATAL("Error in reading %s\n", accum_dir[i]);
        }
    }

    if (n_mgau != n_mgau_rd) {
        E_FATAL("n_mgau mismatch (%u : %u)\n",n_mgau,n_mgau_rd);
    }
    if (n_stream != n_stream_rd) {
        E_FATAL("n_stream mismatch (%u : %u)\n",n_stream,n_stream_rd);
    }
    if (n_density != n_density_rd) {
        E_FATAL("n_density mismatch (%u : %u)\n",n_density,n_density_rd);
    }
    for (s = 0; s < n_stream; s++) {
        if (veclen[s] != veclen_rd[s]) {
            E_FATAL("vector length of stream %u (== %u) "
                    "!= prior length (== %u)\n",
                    s, veclen_rd[s], veclen[s]);
        }
    }
    ckd_free((void *)veclen_rd);
    veclen_rd = NULL;
    if (wt_var) {               /* We don't use 'wt_var' in this program. */
        gauden_free_param(wt_var);
        wt_var = NULL;
    }

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 2. Read cb2mllrfn\n");
    /*--------------------------------------------------------------------*/

    if (strcmp(cb2mllrfn, ".1cls.") == 0) {
        n_mllr_class = 1;
        cb2mllr = (int32 *) ckd_calloc(n_mgau, sizeof(int32));
    }
    else {
        if (s3cb2mllr_read(cb2mllrfn,
                           &cb2mllr,
                           &n_mgau_rd,
                           &n_mllr_class) != S3_SUCCESS) {
            E_FATAL("Unable to read %s\n",cb2mllrfn);
        }
        if (n_mgau_rd != n_mgau) {
            E_FATAL("cb2mllr maps %u cb, but read %u cb from files\n",
                    n_mgau_rd, n_mgau);
        }
    }
    E_INFO("n_mllr_class = %d\n", n_mllr_class);

    gau_begin = 0;
    if (cdonly) {

        if (! moddeffn) {
            E_FATAL("-moddeffn is not given.\n");
        }
        else if (model_def_read(&mdef, moddeffn) != S3_SUCCESS) {
            E_FATAL("Can not read model definition file %s\n", moddeffn);
        }
        gau_begin = mdef->n_tied_ci_state;
        for (i=0; i<gau_begin; i++) {
            cb2mllr[i] = -1;                    /* skip CI senones */
        }
        E_INFO("Use CD senones only. (index >= %d)\n",mdef->n_tied_ci_state);
    }

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 3. Calculate mllr matrices\n");
    /*--------------------------------------------------------------------*/

    mllr_mat(&A,
	     &B,
	     var_fn,
	     mean,
	     wt_mean,
	     wt_dcount,
	     gau_begin,
	     cb2mllr,
	     mllr_mult,
	     mllr_add,
	     varfloor,
	     n_mgau,
	     n_stream,
	     n_density,
	     n_mllr_class,
	     veclen);

    /*--------------------------------------------------------------------*/
    fprintf(stderr,"\n");
    E_INFO("-- 4. Store mllr matrices (A,B) to %s\n", out_mllr_fn);
fflush(stderr);
    /*--------------------------------------------------------------------*/

    if(store_reg_mat(out_mllr_fn,
                     veclen,
                     n_mllr_class,
                     n_stream,
                     A,
                     B) != S3_SUCCESS) {
        E_FATAL("Unable to write %s\n", out_mllr_fn);
    }

    ckd_free((void *)veclen);
    free_mllr_A(A, n_mllr_class, n_stream);
    free_mllr_B(B, n_mllr_class, n_stream);
    return 0 ;
}